

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kgc(jit_State *J,GCobj *o,IRType t)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint local_44;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  IRType t_local;
  GCobj *o_local;
  jit_State *J_local;
  IRRef ref_1;
  
  pIVar2 = (J->cur).ir;
  uVar1 = J->chain[0x18];
  while (local_44 = (uint)uVar1, local_44 != 0) {
    if (pIVar2[(ulong)local_44 + 1] == (IRIns)o) goto LAB_001a4345;
    uVar1 = *(ushort *)((long)pIVar2 + (ulong)local_44 * 8 + 6);
  }
  local_44 = (J->cur).nk - 2;
  if (local_44 < J->irbotlim) {
    lj_ir_growbot(J);
  }
  (J->cur).nk = local_44;
  pIVar2 = (J->cur).ir + local_44;
  (pIVar2->field_1).op12 = 0;
  pIVar2[1] = (IRIns)o;
  (pIVar2->field_1).t.irt = (uint8_t)t;
  (pIVar2->field_1).o = '\x18';
  (pIVar2->field_0).prev = J->chain[0x18];
  J->chain[0x18] = (IRRef1)local_44;
LAB_001a4345:
  return local_44 + t * 0x1000000;
}

Assistant:

TRef lj_ir_kgc(jit_State *J, GCobj *o, IRType t)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  lj_assertJ(!isdead(J2G(J), o), "interning of dead GC object");
  for (ref = J->chain[IR_KGC]; ref; ref = cir[ref].prev)
    if (ir_kgc(&cir[ref]) == o)
      goto found;
  ref = ir_nextkgc(J);
  ir = IR(ref);
  /* NOBARRIER: Current trace is a GC root. */
  ir->op12 = 0;
  setgcref(ir[LJ_GC64].gcr, o);
  ir->t.irt = (uint8_t)t;
  ir->o = IR_KGC;
  ir->prev = J->chain[IR_KGC];
  J->chain[IR_KGC] = (IRRef1)ref;
found:
  return TREF(ref, t);
}